

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::print_fn_args_doc(t_html_generator *this,t_function *tfunction)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  t_struct *ptVar4;
  members_type *pmVar5;
  ulong uVar6;
  ostream *poVar7;
  string *psVar8;
  reference pptVar9;
  t_type *ptVar10;
  undefined4 extraout_var;
  string local_108;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_e8;
  t_field **local_e0;
  t_field **local_d8;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_d0;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c0;
  iterator ex_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  string local_98;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_78;
  t_field **local_70;
  t_field **local_68;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_50;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_48;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_40;
  iterator arg_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  bool has_docs;
  t_function *tfunction_local;
  t_html_generator *this_local;
  
  bVar2 = false;
  ptVar4 = t_function::get_arglist(tfunction);
  pmVar5 = t_struct::get_members(ptVar4);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter,pmVar5);
  local_40._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
  local_48._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
  bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
  if (bVar1) {
    while( true ) {
      local_50._M_current =
           (t_field **)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
      if (!bVar1) break;
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
                operator*(&local_40);
      bVar1 = t_doc::has_doc(&(*pptVar9)->super_t_doc);
      if (bVar1) {
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_40);
        t_doc::get_doc_abi_cxx11_(&(*pptVar9)->super_t_doc);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          bVar2 = true;
        }
      }
      local_68 = (t_field **)
                 __gnu_cxx::
                 __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator++(&local_40,0);
    }
    if (bVar2) {
      local_70 = (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
      local_40._M_current = local_70;
      poVar7 = std::operator<<((ostream *)&this->f_out_,"<br/><h4 id=\"Parameters_");
      poVar7 = std::operator<<(poVar7,(string *)&(this->super_t_generator).service_name_);
      poVar7 = std::operator<<(poVar7,"_");
      psVar8 = t_function::get_name_abi_cxx11_(tfunction);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      poVar7 = std::operator<<(poVar7,"\">Parameters</h4>");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::operator<<((ostream *)&this->f_out_,
                      "<table class=\"table-bordered table-striped table-condensed\">");
      std::operator<<((ostream *)&this->f_out_,
                      "<thead><tr><th>Name</th><th>Description</th></tr></thead><tbody>");
      while( true ) {
        local_78._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
        bVar2 = __gnu_cxx::operator!=(&local_40,&local_78);
        if (!bVar2) break;
        poVar7 = std::operator<<((ostream *)&this->f_out_,"<tr><td>");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_40);
        psVar8 = t_field::get_name_abi_cxx11_(*pptVar9);
        std::operator<<(poVar7,(string *)psVar8);
        std::operator<<((ostream *)&this->f_out_,"</td><td>");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_40);
        psVar8 = t_doc::get_doc_abi_cxx11_(&(*pptVar9)->super_t_doc);
        escape_html(&local_98,this,psVar8);
        std::operator<<((ostream *)&this->f_out_,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        poVar7 = std::operator<<((ostream *)&this->f_out_,"</td></tr>");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        __gnu_cxx::
        __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_40,0);
      }
      std::operator<<((ostream *)&this->f_out_,"</tbody></table>");
    }
  }
  bVar2 = false;
  ptVar4 = t_function::get_xceptions(tfunction);
  pmVar5 = t_struct::get_members(ptVar4);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter,pmVar5);
  local_c0._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
  local_c8._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
  bVar1 = __gnu_cxx::operator!=(&local_c0,&local_c8);
  if (bVar1) {
    while( true ) {
      local_d0._M_current =
           (t_field **)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
      bVar1 = __gnu_cxx::operator!=(&local_c0,&local_d0);
      if (!bVar1) break;
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
                operator*(&local_c0);
      bVar1 = t_doc::has_doc(&(*pptVar9)->super_t_doc);
      if (bVar1) {
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_c0);
        t_doc::get_doc_abi_cxx11_(&(*pptVar9)->super_t_doc);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          bVar2 = true;
        }
      }
      local_d8 = (t_field **)
                 __gnu_cxx::
                 __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator++(&local_c0,0);
    }
    if (bVar2) {
      local_e0 = (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
      local_c0._M_current = local_e0;
      poVar7 = std::operator<<((ostream *)&this->f_out_,"<br/><h4 id=\"Exceptions_");
      poVar7 = std::operator<<(poVar7,(string *)&(this->super_t_generator).service_name_);
      poVar7 = std::operator<<(poVar7,"_");
      psVar8 = t_function::get_name_abi_cxx11_(tfunction);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      poVar7 = std::operator<<(poVar7,"\">Exceptions</h4>");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::operator<<((ostream *)&this->f_out_,
                      "<table class=\"table-bordered table-striped table-condensed\">");
      std::operator<<((ostream *)&this->f_out_,
                      "<thead><tr><th>Type</th><th>Description</th></tr></thead><tbody>");
      while( true ) {
        local_e8._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
        bVar2 = __gnu_cxx::operator!=(&local_c0,&local_e8);
        if (!bVar2) break;
        poVar7 = std::operator<<((ostream *)&this->f_out_,"<tr><td>");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_c0);
        ptVar10 = t_field::get_type(*pptVar9);
        iVar3 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])();
        std::operator<<(poVar7,(string *)CONCAT44(extraout_var,iVar3));
        std::operator<<((ostream *)&this->f_out_,"</td><td>");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_c0);
        psVar8 = t_doc::get_doc_abi_cxx11_(&(*pptVar9)->super_t_doc);
        escape_html(&local_108,this,psVar8);
        std::operator<<((ostream *)&this->f_out_,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        poVar7 = std::operator<<((ostream *)&this->f_out_,"</td></tr>");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        __gnu_cxx::
        __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_c0,0);
      }
      std::operator<<((ostream *)&this->f_out_,"</tbody></table>");
    }
  }
  std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
  return;
}

Assistant:

void t_html_generator::print_fn_args_doc(t_function* tfunction) {
  bool has_docs = false;
  vector<t_field*> args = tfunction->get_arglist()->get_members();
  vector<t_field*>::iterator arg_iter = args.begin();
  if (arg_iter != args.end()) {
    for (; arg_iter != args.end(); arg_iter++) {
      if ((*arg_iter)->has_doc() && !(*arg_iter)->get_doc().empty())
        has_docs = true;
    }
    if (has_docs) {
      arg_iter = args.begin();
      f_out_ << "<br/><h4 id=\"Parameters_" << service_name_ << "_" << tfunction->get_name()
             << "\">Parameters</h4>" << endl;
      f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
      f_out_ << "<thead><tr><th>Name</th><th>Description</th></tr></thead><tbody>";
      for (; arg_iter != args.end(); arg_iter++) {
        f_out_ << "<tr><td>" << (*arg_iter)->get_name();
        f_out_ << "</td><td>";
        f_out_ << escape_html((*arg_iter)->get_doc());
        f_out_ << "</td></tr>" << endl;
      }
      f_out_ << "</tbody></table>";
    }
  }

  has_docs = false;
  vector<t_field*> excepts = tfunction->get_xceptions()->get_members();
  vector<t_field*>::iterator ex_iter = excepts.begin();
  if (ex_iter != excepts.end()) {
    for (; ex_iter != excepts.end(); ex_iter++) {
      if ((*ex_iter)->has_doc() && !(*ex_iter)->get_doc().empty())
        has_docs = true;
    }
    if (has_docs) {
      ex_iter = excepts.begin();
      f_out_ << "<br/><h4 id=\"Exceptions_" << service_name_ << "_" << tfunction->get_name()
             << "\">Exceptions</h4>" << endl;
      f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
      f_out_ << "<thead><tr><th>Type</th><th>Description</th></tr></thead><tbody>";
      for (; ex_iter != excepts.end(); ex_iter++) {
        f_out_ << "<tr><td>" << (*ex_iter)->get_type()->get_name();
        f_out_ << "</td><td>";
        f_out_ << escape_html((*ex_iter)->get_doc());
        f_out_ << "</td></tr>" << endl;
      }
      f_out_ << "</tbody></table>";
    }
  }
}